

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

double __thiscall tetgenmesh::incircle3d(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  double r;
  double c [3];
  double n2 [3];
  double n1 [3];
  double local_c8;
  tetgenmesh *local_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  double local_80;
  double local_78;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_c0 = this;
  facenormal(this,pa,pb,pc,&local_48,1,(double *)0x0);
  local_a8 = local_48;
  dStack_a0 = dStack_40;
  local_b8 = dStack_40;
  dStack_b0 = local_38;
  local_98 = local_38;
  uStack_90 = 0;
  facenormal(this,pb,pa,pd,&local_68,1,(double *)0x0);
  dVar4 = local_58 * local_58 + local_68 * local_68 + local_60 * local_60;
  if (local_98 * local_98 + local_a8 * local_a8 + local_b8 * local_b8 <= dVar4) {
    uVar2 = 0;
    uVar3 = 0;
    if (dVar4 <= 0.0) goto LAB_0011922a;
    circumsphere(this,pb,pa,pd,(double *)0x0,&local_88,&local_c8);
    dVar4 = (*pc - local_88) * (*pc - local_88) + (pc[1] - local_80) * (pc[1] - local_80);
    pd = pc;
  }
  else {
    circumsphere(this,pa,pb,pc,(double *)0x0,&local_88,&local_c8);
    dVar4 = (*pd - local_88) * (*pd - local_88) + (pd[1] - local_80) * (pd[1] - local_80);
  }
  dVar4 = SQRT((pd[2] - local_78) * (pd[2] - local_78) + dVar4) - local_c8;
  uVar1 = ~-(ulong)(ABS(dVar4) / local_c8 < local_c0->b->epsilon) & (ulong)dVar4;
  uVar2 = (undefined4)uVar1;
  uVar3 = (undefined4)(uVar1 >> 0x20);
LAB_0011922a:
  return (double)CONCAT44(uVar3,uVar2);
}

Assistant:

REAL tetgenmesh::incircle3d(point pa, point pb, point pc, point pd)
{
  REAL area2[2], n1[3], n2[3], c[3];
  REAL sign, r, d;

  // Calculate the areas of the two triangles [a, b, c] and [b, a, d].
  facenormal(pa, pb, pc, n1, 1, NULL);
  area2[0] = dot(n1, n1);
  facenormal(pb, pa, pd, n2, 1, NULL);
  area2[1] = dot(n2, n2);

  if (area2[0] > area2[1]) {
    // Choose [a, b, c] as the base triangle.
    circumsphere(pa, pb, pc, NULL, c, &r);
    d = distance(c, pd);
  } else {
    // Choose [b, a, d] as the base triangle.
    if (area2[1] > 0) {
      circumsphere(pb, pa, pd, NULL, c, &r);
      d = distance(c, pc);
    } else {
      // The four points are collinear. This case only happens on the boundary.
      return 0; // Return "not inside".
    }
  }

  sign = d - r;
  if (fabs(sign) / r < b->epsilon) {
    sign = 0;
  }

  return sign;
}